

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O1

void prvTidyDropAttrByName(TidyDocImpl *doc,Node *node,ctmbstr name)

{
  AttVal *pAVar1;
  int iVar2;
  AttVal *pAVar3;
  AttVal *pAVar4;
  AttVal *av;
  
  if (node->attributes != (AttVal *)0x0) {
    pAVar4 = (AttVal *)0x0;
    av = node->attributes;
    do {
      pAVar1 = av->next;
      if (av->attribute != (ctmbstr)0x0) {
        iVar2 = prvTidytmbstrcmp(av->attribute,name);
        if (iVar2 == 0) {
          pAVar3 = (AttVal *)&node->attributes;
          if (pAVar4 != (AttVal *)0x0) {
            pAVar3 = pAVar4;
          }
          pAVar3->next = pAVar1;
          prvTidyFreeAttribute(doc,av);
          return;
        }
      }
      pAVar4 = av;
      av = pAVar1;
    } while (pAVar1 != (AttVal *)0x0);
  }
  return;
}

Assistant:

void TY_(DropAttrByName)( TidyDocImpl* doc, Node *node, ctmbstr name )
{
    AttVal *attr, *prev = NULL, *next;

    for (attr = node->attributes; attr != NULL; prev = attr, attr = next)
    {
        next = attr->next;

        if (attr->attribute && TY_(tmbstrcmp)(attr->attribute, name) == 0)
        {
            if (prev)
                 prev->next = next;
            else
                 node->attributes = next;

            TY_(FreeAttribute)( doc, attr ); 
            break;
        }
    }
}